

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int matchpattern(regex_t *pattern,char *text,int *matchlength)

{
  byte bVar1;
  byte bVar2;
  char c;
  anon_union_8_2_c9599718_for_u aVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int prelen;
  int iVar7;
  char *prepoint;
  regex_t *pattern_00;
  regex_t p;
  regex_t p_00;
  regex_t p_01;
  regex_t p_02;
  
  iVar5 = *matchlength;
  pattern_00 = pattern + 2;
  iVar7 = iVar5;
  bVar1 = pattern->type;
  do {
    if (bVar1 == 0) {
      return 1;
    }
    bVar2 = pattern_00[-1].type;
    if (bVar2 == 6) {
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      pcVar6 = text;
      while( true ) {
        iVar7 = iVar7 + 1;
        if ((*pcVar6 == '\0') ||
           (p_00.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl,
           p_00._0_8_ = CONCAT71(0,bVar1), iVar5 = matchone(p_00,*pcVar6), iVar5 == 0)) break;
        pcVar6 = pcVar6 + 1;
        *matchlength = iVar7;
      }
      while( true ) {
        if (pcVar6 <= text) {
          return 0;
        }
        iVar5 = matchpattern(pattern_00,pcVar6,matchlength);
        if (iVar5 != 0) break;
        pcVar6 = pcVar6 + -1;
        *matchlength = *matchlength + -1;
      }
      return 1;
    }
    if (bVar2 == 5) {
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      pcVar6 = text;
      iVar5 = iVar7;
      while( true ) {
        iVar5 = iVar5 + 1;
        if ((*pcVar6 == '\0') ||
           (p_01._1_7_ = 0, p_01.type = bVar1,
           p_01.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl,
           iVar4 = matchone(p_01,*pcVar6), iVar4 == 0)) break;
        pcVar6 = pcVar6 + 1;
        *matchlength = iVar5;
      }
      while( true ) {
        if (pcVar6 < text) {
          *matchlength = iVar7;
          return 0;
        }
        iVar5 = matchpattern(pattern_00,pcVar6,matchlength);
        if (iVar5 != 0) break;
        pcVar6 = pcVar6 + -1;
        *matchlength = *matchlength + -1;
      }
      return 1;
    }
    if (bVar2 == 4) {
      aVar3 = (anon_union_8_2_c9599718_for_u)pattern_00[-2].u.ccl;
      iVar5 = matchpattern(pattern_00,text,matchlength);
      if (iVar5 != 0) {
        return 1;
      }
      if (*text == '\0') {
        return 0;
      }
      p_02.u = (anon_union_8_2_c9599718_for_u)(anon_union_8_2_c9599718_for_u)aVar3.ccl;
      p_02._0_8_ = CONCAT71(0,bVar1);
      iVar5 = matchone(p_02,*text);
      if (iVar5 == 0) {
        return 0;
      }
      iVar5 = matchpattern(pattern_00,text + 1,matchlength);
      if (iVar5 != 0) {
        *matchlength = *matchlength + 1;
        return 1;
      }
      return 0;
    }
    if (bVar1 == 3 && bVar2 == 0) {
      return (uint)(*text == '\0');
    }
    iVar7 = iVar7 + 1;
    *matchlength = iVar7;
    c = *text;
    if (c == '\0') break;
    text = text + 1;
    p._4_4_ = 0;
    p.type = pattern_00[-2].type;
    p._1_3_ = *(undefined3 *)&pattern_00[-2].field_0x1;
    p.u.ccl = pattern_00[-2].u.ccl;
    iVar4 = matchone(p,c);
    pattern_00 = pattern_00 + 1;
    bVar1 = bVar2;
  } while (iVar4 != 0);
  *matchlength = iVar5;
  return 0;
}

Assistant:

static int matchpattern(regex_t* pattern, const char* text, int* matchlength)
{
  int pre = *matchlength;
  do
  {
    if ((pattern[0].type == UNUSED) || (pattern[1].type == QUESTIONMARK))
    {
      return matchquestion(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == STAR)
    {
      return matchstar(pattern[0], &pattern[2], text, matchlength);
    }
    else if (pattern[1].type == PLUS)
    {
      return matchplus(pattern[0], &pattern[2], text, matchlength);
    }
    else if ((pattern[0].type == END) && pattern[1].type == UNUSED)
    {
      return (text[0] == '\0');
    }
/*  Branching is not working properly
    else if (pattern[1].type == BRANCH)
    {
      return (matchpattern(pattern, text) || matchpattern(&pattern[2], text));
    }
*/
  (*matchlength)++;
  }
  while ((text[0] != '\0') && matchone(*pattern++, *text++));

  *matchlength = pre;
  return 0;
}